

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bspwm.cpp
# Opt level: O0

void __thiscall rw::BSPWM::swap(BSPWM *this,Window *a,Window *b)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  undefined1 local_107;
  allocator local_106;
  allocator local_105 [20];
  allocator local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [32];
  string local_a8;
  string local_88 [32];
  string local_68;
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  Window *local_20;
  Window *b_local;
  Window *a_local;
  BSPWM *this_local;
  
  local_107 = 1;
  local_f0 = &local_e8;
  local_20 = b;
  b_local = a;
  a_local = (Window *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"bspc",&local_f1);
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"node",local_105);
  local_f0 = &local_a8;
  std::__cxx11::to_string(local_f0,b_local->window_id);
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"--swap",&local_106);
  local_f0 = &local_68;
  std::__cxx11::to_string(local_f0,local_20->window_id);
  local_107 = 0;
  local_48 = &local_e8;
  local_40 = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_108);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,__l,&local_108);
  subprocess::call(&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_108);
  local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
  do {
    local_148 = local_148 + -1;
    std::__cxx11::string::~string((string *)local_148);
  } while (local_148 != &local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_106);
  std::allocator<char>::~allocator((allocator<char> *)local_105);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  return;
}

Assistant:

void BSPWM::swap(const Window *a, const Window *b) {
        subprocess::call({"bspc", "node", to_string(a->window_id),
                          "--swap", to_string(b->window_id)});
    }